

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O0

int __thiscall OpenSSLWrapper::SslConnection::SslInitFinished(SslConnection *this)

{
  int iVar1;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lk;
  SslConnection *this_local;
  
  lk._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->m_mxSsl);
  iVar1 = SSL_is_init_finished(this->m_ssl);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return iVar1;
}

Assistant:

int SslConnection::SslInitFinished()
    {
        lock_guard<mutex> lk(m_mxSsl);
        return SSL_is_init_finished(m_ssl);
    }